

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaK_code(FuncState *fs,Instruction i,int line)

{
  Proto *pPVar1;
  Instruction *pIVar2;
  int *piVar3;
  int iVar4;
  
  pPVar1 = fs->f;
  patchlistaux(fs,fs->jpc,fs->pc,0xff,fs->pc);
  fs->jpc = -1;
  iVar4 = fs->pc;
  if (iVar4 < pPVar1->sizecode) {
    pIVar2 = pPVar1->code;
  }
  else {
    pIVar2 = (Instruction *)
             luaM_growaux_(fs->L,pPVar1->code,&pPVar1->sizecode,4,0x7ffffffd,"code size overflow");
    pPVar1->code = pIVar2;
    iVar4 = fs->pc;
  }
  pIVar2[iVar4] = i;
  iVar4 = fs->pc;
  if (iVar4 < pPVar1->sizelineinfo) {
    piVar3 = pPVar1->lineinfo;
  }
  else {
    piVar3 = (int *)luaM_growaux_(fs->L,pPVar1->lineinfo,&pPVar1->sizelineinfo,4,0x7ffffffd,
                                  "code size overflow");
    pPVar1->lineinfo = piVar3;
    iVar4 = fs->pc;
  }
  piVar3[iVar4] = line;
  iVar4 = fs->pc;
  fs->pc = iVar4 + 1;
  return iVar4;
}

Assistant:

static int luaK_code(FuncState*fs,Instruction i,int line){
Proto*f=fs->f;
dischargejpc(fs);
luaM_growvector(fs->L,f->code,fs->pc,f->sizecode,Instruction,
(INT_MAX-2),"code size overflow");
f->code[fs->pc]=i;
luaM_growvector(fs->L,f->lineinfo,fs->pc,f->sizelineinfo,int,
(INT_MAX-2),"code size overflow");
f->lineinfo[fs->pc]=line;
return fs->pc++;
}